

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathDebugDumpStepOp(FILE *output,xmlXPathCompExprPtr comp,xmlXPathStepOpPtr op,int depth)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  xmlXPathObjectPtr cur;
  xmlChar *name_2;
  xmlChar *prefix_2;
  int nbargs;
  xmlChar *name_1;
  xmlChar *prefix_1;
  xmlXPathObjectPtr object;
  xmlChar *name;
  xmlChar *prefix;
  xmlXPathTypeVal type;
  xmlXPathTestVal test;
  xmlXPathAxisVal axis;
  char shift [100];
  int local_28;
  int i;
  int depth_local;
  xmlXPathStepOpPtr op_local;
  xmlXPathCompExprPtr comp_local;
  FILE *output_local;
  
  for (local_28 = 0; local_28 < depth && local_28 < 0x19; local_28 = local_28 + 1) {
    *(undefined1 *)((long)&test + (long)(local_28 * 2 + 1)) = 0x20;
    *(undefined1 *)((long)&test + (long)(local_28 << 1)) = 0x20;
  }
  *(undefined1 *)((long)&test + (long)(local_28 * 2 + 1)) = 0;
  *(undefined1 *)((long)&test + (long)(local_28 << 1)) = 0;
  fprintf((FILE *)output,"%s",&test);
  if (op == (xmlXPathStepOpPtr)0x0) {
    fprintf((FILE *)output,"Step is NULL\n");
    return;
  }
  switch(op->op) {
  case XPATH_OP_END:
    fprintf((FILE *)output,"END");
    break;
  case XPATH_OP_AND:
    fprintf((FILE *)output,"AND");
    break;
  case XPATH_OP_OR:
    fprintf((FILE *)output,"OR");
    break;
  case XPATH_OP_EQUAL:
    if (op->value == 0) {
      fprintf((FILE *)output,"EQUAL !=");
    }
    else {
      fprintf((FILE *)output,"EQUAL =");
    }
    break;
  case XPATH_OP_CMP:
    if (op->value == 0) {
      fprintf((FILE *)output,"CMP >");
    }
    else {
      fprintf((FILE *)output,"CMP <");
    }
    if (op->value2 == 0) {
      fprintf((FILE *)output,"=");
    }
    break;
  case XPATH_OP_PLUS:
    if (op->value == 0) {
      fprintf((FILE *)output,"PLUS -");
    }
    else if (op->value == 1) {
      fprintf((FILE *)output,"PLUS +");
    }
    else if (op->value == 2) {
      fprintf((FILE *)output,"PLUS unary -");
    }
    else if (op->value == 3) {
      fprintf((FILE *)output,"PLUS unary - -");
    }
    break;
  case XPATH_OP_MULT:
    if (op->value == 0) {
      fprintf((FILE *)output,"MULT *");
    }
    else if (op->value == 1) {
      fprintf((FILE *)output,"MULT div");
    }
    else {
      fprintf((FILE *)output,"MULT mod");
    }
    break;
  case XPATH_OP_UNION:
    fprintf((FILE *)output,"UNION");
    break;
  case XPATH_OP_ROOT:
    fprintf((FILE *)output,"ROOT");
    break;
  case XPATH_OP_NODE:
    fprintf((FILE *)output,"NODE");
    break;
  case XPATH_OP_COLLECT:
    iVar1 = op->value;
    iVar2 = op->value2;
    iVar3 = op->value3;
    pvVar4 = op->value4;
    pvVar5 = op->value5;
    fprintf((FILE *)output,"COLLECT ");
    switch(iVar1) {
    case 1:
      fprintf((FILE *)output," \'ancestors\' ");
      break;
    case 2:
      fprintf((FILE *)output," \'ancestors-or-self\' ");
      break;
    case 3:
      fprintf((FILE *)output," \'attributes\' ");
      break;
    case 4:
      fprintf((FILE *)output," \'child\' ");
      break;
    case 5:
      fprintf((FILE *)output," \'descendant\' ");
      break;
    case 6:
      fprintf((FILE *)output," \'descendant-or-self\' ");
      break;
    case 7:
      fprintf((FILE *)output," \'following\' ");
      break;
    case 8:
      fprintf((FILE *)output," \'following-siblings\' ");
      break;
    case 9:
      fprintf((FILE *)output," \'namespace\' ");
      break;
    case 10:
      fprintf((FILE *)output," \'parent\' ");
      break;
    case 0xb:
      fprintf((FILE *)output," \'preceding\' ");
      break;
    case 0xc:
      fprintf((FILE *)output," \'preceding-sibling\' ");
      break;
    case 0xd:
      fprintf((FILE *)output," \'self\' ");
    }
    switch(iVar2) {
    case 0:
      fprintf((FILE *)output,"\'none\' ");
      break;
    case 1:
      fprintf((FILE *)output,"\'type\' ");
      break;
    case 2:
      fprintf((FILE *)output,"\'PI\' ");
      break;
    case 3:
      fprintf((FILE *)output,"\'all\' ");
      break;
    case 4:
      fprintf((FILE *)output,"\'namespace\' ");
      break;
    case 5:
      fprintf((FILE *)output,"\'name\' ");
    }
    switch(iVar3) {
    case 0:
      fprintf((FILE *)output,"\'node\' ");
      break;
    case 3:
      fprintf((FILE *)output,"\'text\' ");
      break;
    case 7:
      fprintf((FILE *)output,"\'PI\' ");
      break;
    case 8:
      fprintf((FILE *)output,"\'comment\' ");
    }
    if (pvVar4 != (void *)0x0) {
      fprintf((FILE *)output,"%s:",pvVar4);
    }
    if (pvVar5 != (void *)0x0) {
      fprintf((FILE *)output,"%s",pvVar5);
    }
    break;
  case XPATH_OP_VALUE:
    cur = (xmlXPathObjectPtr)op->value4;
    fprintf((FILE *)output,"ELEM ");
    xmlXPathDebugDumpObject(output,cur,0);
    goto LAB_0021dda6;
  case XPATH_OP_VARIABLE:
    if (op->value5 == (void *)0x0) {
      fprintf((FILE *)output,"VARIABLE %s",op->value4);
    }
    else {
      fprintf((FILE *)output,"VARIABLE %s:%s",op->value5,op->value4);
    }
    break;
  case XPATH_OP_FUNCTION:
    if (op->value5 == (void *)0x0) {
      fprintf((FILE *)output,"FUNCTION %s(%d args)",op->value4,(ulong)(uint)op->value);
    }
    else {
      fprintf((FILE *)output,"FUNCTION %s:%s(%d args)",op->value5,op->value4,(ulong)(uint)op->value)
      ;
    }
    break;
  case XPATH_OP_ARG:
    fprintf((FILE *)output,"ARG");
    break;
  case XPATH_OP_PREDICATE:
    fprintf((FILE *)output,"PREDICATE");
    break;
  case XPATH_OP_FILTER:
    fprintf((FILE *)output,"FILTER");
    break;
  case XPATH_OP_SORT:
    fprintf((FILE *)output,"SORT");
    break;
  default:
    fprintf((FILE *)output,"UNKNOWN %d\n",(ulong)op->op);
    return;
  }
  fprintf((FILE *)output,"\n");
LAB_0021dda6:
  if (op->op != XPATH_OP_VALUE) {
    if (-1 < op->ch1) {
      xmlXPathDebugDumpStepOp(output,comp,comp->steps + op->ch1,depth + 1);
    }
    if (-1 < op->ch2) {
      xmlXPathDebugDumpStepOp(output,comp,comp->steps + op->ch2,depth + 1);
    }
  }
  return;
}

Assistant:

static void
xmlXPathDebugDumpStepOp(FILE *output, xmlXPathCompExprPtr comp,
	                     xmlXPathStepOpPtr op, int depth) {
    int i;
    char shift[100];

    for (i = 0;((i < depth) && (i < 25));i++)
        shift[2 * i] = shift[2 * i + 1] = ' ';
    shift[2 * i] = shift[2 * i + 1] = 0;

    fprintf(output, "%s", shift);
    if (op == NULL) {
	fprintf(output, "Step is NULL\n");
	return;
    }
    switch (op->op) {
        case XPATH_OP_END:
	    fprintf(output, "END"); break;
        case XPATH_OP_AND:
	    fprintf(output, "AND"); break;
        case XPATH_OP_OR:
	    fprintf(output, "OR"); break;
        case XPATH_OP_EQUAL:
	     if (op->value)
		 fprintf(output, "EQUAL =");
	     else
		 fprintf(output, "EQUAL !=");
	     break;
        case XPATH_OP_CMP:
	     if (op->value)
		 fprintf(output, "CMP <");
	     else
		 fprintf(output, "CMP >");
	     if (!op->value2)
		 fprintf(output, "=");
	     break;
        case XPATH_OP_PLUS:
	     if (op->value == 0)
		 fprintf(output, "PLUS -");
	     else if (op->value == 1)
		 fprintf(output, "PLUS +");
	     else if (op->value == 2)
		 fprintf(output, "PLUS unary -");
	     else if (op->value == 3)
		 fprintf(output, "PLUS unary - -");
	     break;
        case XPATH_OP_MULT:
	     if (op->value == 0)
		 fprintf(output, "MULT *");
	     else if (op->value == 1)
		 fprintf(output, "MULT div");
	     else
		 fprintf(output, "MULT mod");
	     break;
        case XPATH_OP_UNION:
	     fprintf(output, "UNION"); break;
        case XPATH_OP_ROOT:
	     fprintf(output, "ROOT"); break;
        case XPATH_OP_NODE:
	     fprintf(output, "NODE"); break;
        case XPATH_OP_SORT:
	     fprintf(output, "SORT"); break;
        case XPATH_OP_COLLECT: {
	    xmlXPathAxisVal axis = (xmlXPathAxisVal)op->value;
	    xmlXPathTestVal test = (xmlXPathTestVal)op->value2;
	    xmlXPathTypeVal type = (xmlXPathTypeVal)op->value3;
	    const xmlChar *prefix = op->value4;
	    const xmlChar *name = op->value5;

	    fprintf(output, "COLLECT ");
	    switch (axis) {
		case AXIS_ANCESTOR:
		    fprintf(output, " 'ancestors' "); break;
		case AXIS_ANCESTOR_OR_SELF:
		    fprintf(output, " 'ancestors-or-self' "); break;
		case AXIS_ATTRIBUTE:
		    fprintf(output, " 'attributes' "); break;
		case AXIS_CHILD:
		    fprintf(output, " 'child' "); break;
		case AXIS_DESCENDANT:
		    fprintf(output, " 'descendant' "); break;
		case AXIS_DESCENDANT_OR_SELF:
		    fprintf(output, " 'descendant-or-self' "); break;
		case AXIS_FOLLOWING:
		    fprintf(output, " 'following' "); break;
		case AXIS_FOLLOWING_SIBLING:
		    fprintf(output, " 'following-siblings' "); break;
		case AXIS_NAMESPACE:
		    fprintf(output, " 'namespace' "); break;
		case AXIS_PARENT:
		    fprintf(output, " 'parent' "); break;
		case AXIS_PRECEDING:
		    fprintf(output, " 'preceding' "); break;
		case AXIS_PRECEDING_SIBLING:
		    fprintf(output, " 'preceding-sibling' "); break;
		case AXIS_SELF:
		    fprintf(output, " 'self' "); break;
	    }
	    switch (test) {
                case NODE_TEST_NONE:
		    fprintf(output, "'none' "); break;
                case NODE_TEST_TYPE:
		    fprintf(output, "'type' "); break;
                case NODE_TEST_PI:
		    fprintf(output, "'PI' "); break;
                case NODE_TEST_ALL:
		    fprintf(output, "'all' "); break;
                case NODE_TEST_NS:
		    fprintf(output, "'namespace' "); break;
                case NODE_TEST_NAME:
		    fprintf(output, "'name' "); break;
	    }
	    switch (type) {
                case NODE_TYPE_NODE:
		    fprintf(output, "'node' "); break;
                case NODE_TYPE_COMMENT:
		    fprintf(output, "'comment' "); break;
                case NODE_TYPE_TEXT:
		    fprintf(output, "'text' "); break;
                case NODE_TYPE_PI:
		    fprintf(output, "'PI' "); break;
	    }
	    if (prefix != NULL)
		fprintf(output, "%s:", prefix);
	    if (name != NULL)
		fprintf(output, "%s", (const char *) name);
	    break;

        }
	case XPATH_OP_VALUE: {
	    xmlXPathObjectPtr object = (xmlXPathObjectPtr) op->value4;

	    fprintf(output, "ELEM ");
	    xmlXPathDebugDumpObject(output, object, 0);
	    goto finish;
	}
	case XPATH_OP_VARIABLE: {
	    const xmlChar *prefix = op->value5;
	    const xmlChar *name = op->value4;

	    if (prefix != NULL)
		fprintf(output, "VARIABLE %s:%s", prefix, name);
	    else
		fprintf(output, "VARIABLE %s", name);
	    break;
	}
	case XPATH_OP_FUNCTION: {
	    int nbargs = op->value;
	    const xmlChar *prefix = op->value5;
	    const xmlChar *name = op->value4;

	    if (prefix != NULL)
		fprintf(output, "FUNCTION %s:%s(%d args)",
			prefix, name, nbargs);
	    else
		fprintf(output, "FUNCTION %s(%d args)", name, nbargs);
	    break;
	}
        case XPATH_OP_ARG: fprintf(output, "ARG"); break;
        case XPATH_OP_PREDICATE: fprintf(output, "PREDICATE"); break;
        case XPATH_OP_FILTER: fprintf(output, "FILTER"); break;
	default:
        fprintf(output, "UNKNOWN %d\n", op->op); return;
    }
    fprintf(output, "\n");
finish:
    /* OP_VALUE has invalid ch1. */
    if (op->op == XPATH_OP_VALUE)
        return;

    if (op->ch1 >= 0)
	xmlXPathDebugDumpStepOp(output, comp, &comp->steps[op->ch1], depth + 1);
    if (op->ch2 >= 0)
	xmlXPathDebugDumpStepOp(output, comp, &comp->steps[op->ch2], depth + 1);
}